

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_lookup.c
# Opt level: O2

int64_t user_lookup(void *d,char *name,int64_t u)

{
  int iVar1;
  int64_t iVar2;
  
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'?',(long)*d,"*mp",0x1234,"0x1234",(void *)0x0);
  iVar1 = strcmp("FOO",name);
  iVar2 = 0x4a;
  if (iVar1 == 0) {
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int64_t
user_lookup(void *d, const char *name, int64_t u)
{
	int *mp = d;

	(void)u; /* UNUSED */

	assertEqualInt(*mp, 0x1234);
	if (strcmp("FOO", name) == 0)
		return (2);
	return (74);
}